

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void RGB24ToARGBRow_C(uint8_t *src_rgb24,uint8_t *dst_argb,int width)

{
  uint8_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)width;
  if (width < 1) {
    uVar3 = uVar2;
  }
  for (; (int)uVar3 != (int)uVar2; uVar2 = uVar2 + 1) {
    uVar1 = src_rgb24[2];
    *(undefined2 *)(dst_argb + uVar2 * 4) = *(undefined2 *)src_rgb24;
    dst_argb[uVar2 * 4 + 2] = uVar1;
    dst_argb[uVar2 * 4 + 3] = 0xff;
    src_rgb24 = src_rgb24 + 3;
  }
  return;
}

Assistant:

void RGB24ToARGBRow_C(const uint8_t* src_rgb24, uint8_t* dst_argb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb24[0];
    uint8_t g = src_rgb24[1];
    uint8_t r = src_rgb24[2];
    dst_argb[0] = b;
    dst_argb[1] = g;
    dst_argb[2] = r;
    dst_argb[3] = 255u;
    dst_argb += 4;
    src_rgb24 += 3;
  }
}